

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

void __thiscall Snes_Spc::reset(Snes_Spc *this)

{
  Snes_Spc *in_RDI;
  int in_stack_ffffffffffffffec;
  
  memset((in_RDI->m).ram.ram,0xff,0x10000);
  ram_loaded(in_RDI);
  reset_common(in_RDI,in_stack_ffffffffffffffec);
  Spc_Dsp::reset((Spc_Dsp *)0x832e6a);
  return;
}

Assistant:

void Snes_Spc::reset()
{
	memset( RAM, 0xFF, 0x10000 );
	ram_loaded();
	reset_common( 0x0F );
	dsp.reset();
}